

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

ByteData * __thiscall
cfd::core::ExtPrivkey::GetFingerprintData(ByteData *__return_storage_ptr__,ExtPrivkey *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 4);
  *(uint32_t *)
   local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = this->fingerprint_;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ByteData::ByteData(__return_storage_ptr__,&local_28);
  if ((uint32_t *)
      local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData ExtPrivkey::GetFingerprintData() const {
  std::vector<uint8_t> byte_data(4);
  byte_data[3] = (fingerprint_ >> 24) & 0xff;
  byte_data[2] = (fingerprint_ >> 16) & 0xff;
  byte_data[1] = (fingerprint_ >> 8) & 0xff;
  byte_data[0] = fingerprint_ & 0xff;
  return ByteData(byte_data);
}